

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormalsUtil.h
# Opt level: O0

void MapFormalsWithoutRest<ByteCodeGenerator::EmitOneFunction(ParseNodeFnc*)::__2>
               (ParseNodeFnc *pnodeFunc,anon_class_16_2_85211fcd fn)

{
  ParseNodeFnc *pnodeFunc_local;
  anon_class_16_2_85211fcd fn_local;
  
  MapFormalsImpl<ByteCodeGenerator::EmitOneFunction(ParseNodeFnc*)::__2,false>(pnodeFunc,fn);
  return;
}

Assistant:

void MapFormalsWithoutRest(ParseNodeFnc *pnodeFunc, Fn fn)
{
    return MapFormalsImpl<Fn, false>(pnodeFunc, fn);
}